

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O3

void __thiscall SslTcpSocket::SslTcpSocket(SslTcpSocket *this,TcpSocket *pTcpSock)

{
  BaseSocketImpl *pBVar1;
  TcpSocketImpl *pTcpSocket;
  SslTcpSocketImpl *this_00;
  
  (this->super_TcpSocket).super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = (BaseSocketImpl *)0x0;
  (this->super_TcpSocket).super_BaseSocket._vptr_BaseSocket =
       (_func_int **)&PTR__BaseSocket_00145b18;
  pBVar1 = (pTcpSock->super_BaseSocket).Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    pTcpSocket = (TcpSocketImpl *)0x0;
  }
  else {
    pTcpSocket = (TcpSocketImpl *)
                 __dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  this_00 = (SslTcpSocketImpl *)operator_new(0x530);
  SslTcpSocketImpl::SslTcpSocketImpl(this_00,(BaseSocket *)this,pTcpSocket);
  pBVar1 = (this->super_TcpSocket).super_BaseSocket.Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  (this->super_TcpSocket).super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = (BaseSocketImpl *)this_00;
  if (pBVar1 != (BaseSocketImpl *)0x0) {
    (*pBVar1->_vptr_BaseSocketImpl[1])();
    return;
  }
  return;
}

Assistant:

SslTcpSocket::SslTcpSocket(const TcpSocket* pTcpSock) : TcpSocket(false)   // Switch from Tcp to Ssl/Tls
{
    auto pImpl = pTcpSock->GetImpl();
    Impl_ = make_unique<SslTcpSocketImpl>(this, dynamic_cast<TcpSocketImpl*>(pImpl));
}